

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type.c
# Opt level: O0

value value_type_copy(value v)

{
  type_id id_00;
  int iVar1;
  size_t sVar2;
  value pvVar3;
  value *ppvVar4;
  value pvVar5;
  object obj_00;
  long in_RDI;
  exception ex;
  value cpy_3;
  object obj;
  value cpy_2;
  klass cls;
  value cpy_1;
  function f;
  value cpy;
  value *v_map;
  value *new_v_map;
  value new_v_1;
  size_t size_1;
  size_t index_1;
  value *v_array;
  value *new_v_array;
  value new_v;
  size_t size;
  size_t index;
  type_id id;
  void *in_stack_ffffffffffffff58;
  value *in_stack_ffffffffffffff60;
  klass in_stack_ffffffffffffff68;
  value in_stack_ffffffffffffff70;
  ulong local_48;
  ulong local_20;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_RDI != 0) {
    id_00 = value_type_id(in_stack_ffffffffffffff70);
    iVar1 = type_id_array(id_00);
    if (iVar1 == 0) {
      sVar2 = value_type_count(in_stack_ffffffffffffff58);
      pvVar3 = value_create_array(in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
      ppvVar4 = value_to_array((value)0x10e54c);
      value_to_array((value)0x10e55e);
      for (local_20 = 0; local_20 < sVar2; local_20 = local_20 + 1) {
        pvVar5 = value_type_copy((value)CONCAT44(id_00,in_stack_ffffffffffffffe8));
        ppvVar4[local_20] = pvVar5;
      }
      return pvVar3;
    }
    iVar1 = type_id_map(id_00);
    if (iVar1 == 0) {
      sVar2 = value_type_count(in_stack_ffffffffffffff58);
      pvVar3 = value_create_map(in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
      ppvVar4 = value_to_map((value)0x10e617);
      value_to_map((value)0x10e629);
      for (local_48 = 0; local_48 < sVar2; local_48 = local_48 + 1) {
        pvVar5 = value_type_copy((value)CONCAT44(id_00,in_stack_ffffffffffffffe8));
        ppvVar4[local_48] = pvVar5;
      }
      return pvVar3;
    }
    iVar1 = type_id_function(id_00);
    if (iVar1 == 0) {
      pvVar3 = value_copy(in_stack_ffffffffffffff68);
      if (pvVar3 == (value)0x0) {
        return (value)0x0;
      }
      value_to_function(in_stack_ffffffffffffff60);
      function_increment_reference((function_conflict)in_stack_ffffffffffffff68);
      return pvVar3;
    }
    iVar1 = type_id_class(id_00);
    if (iVar1 == 0) {
      pvVar3 = value_copy(in_stack_ffffffffffffff68);
      if (pvVar3 == (value)0x0) {
        return (value)0x0;
      }
      value_to_class(in_stack_ffffffffffffff60);
      class_increment_reference(in_stack_ffffffffffffff68);
      return pvVar3;
    }
    iVar1 = type_id_object(id_00);
    if (iVar1 == 0) {
      pvVar3 = value_copy(in_stack_ffffffffffffff68);
      if (pvVar3 == (value)0x0) {
        return (value)0x0;
      }
      obj_00 = value_to_object(in_stack_ffffffffffffff60);
      object_increment_reference(obj_00);
      return pvVar3;
    }
    iVar1 = type_id_exception(id_00);
    if (iVar1 == 0) {
      pvVar3 = value_copy(in_stack_ffffffffffffff68);
      if (pvVar3 == (value)0x0) {
        return (value)0x0;
      }
      value_to_exception(pvVar3);
      exception_increment_reference((exception)in_stack_ffffffffffffff68);
      return pvVar3;
    }
    iVar1 = type_id_throwable(id_00);
    if (iVar1 == 0) {
      pvVar3 = value_create_throwable((throwable)0x10e7fd);
      return pvVar3;
    }
    iVar1 = type_id_invalid(id_00);
    if (iVar1 != 0) {
      pvVar3 = value_copy(in_stack_ffffffffffffff68);
      return pvVar3;
    }
  }
  return (value)0x0;
}

Assistant:

value value_type_copy(value v)
{
	if (v != NULL)
	{
		type_id id = value_type_id(v);

		if (type_id_array(id) == 0)
		{
			size_t index, size = value_type_count(v);

			value new_v = value_create_array(NULL, size);

			value *new_v_array = value_to_array(new_v);

			value *v_array = value_to_array(v);

			for (index = 0; index < size; ++index)
			{
				new_v_array[index] = value_type_copy(v_array[index]);
			}

			return new_v;
		}
		else if (type_id_map(id) == 0)
		{
			size_t index, size = value_type_count(v);

			value new_v = value_create_map(NULL, size);

			value *new_v_map = value_to_map(new_v);

			value *v_map = value_to_map(v);

			for (index = 0; index < size; ++index)
			{
				new_v_map[index] = value_type_copy(v_map[index]);
			}

			return new_v;
		}
		else if (type_id_function(id) == 0)
		{
			value cpy = value_copy(v);

			if (cpy != NULL)
			{
				function f = value_to_function(cpy);

				function_increment_reference(f);
			}

			return cpy;
		}
		else if (type_id_class(id) == 0)
		{
			value cpy = value_copy(v);

			if (cpy != NULL)
			{
				klass cls = value_to_class(v);

				class_increment_reference(cls);
			}

			return cpy;
		}
		else if (type_id_object(id) == 0)
		{
			value cpy = value_copy(v);

			if (cpy != NULL)
			{
				object obj = value_to_object(cpy);

				object_increment_reference(obj);
			}

			return cpy;
		}
		else if (type_id_exception(id) == 0)
		{
			value cpy = value_copy(v);

			if (cpy != NULL)
			{
				exception ex = value_to_exception(cpy);

				exception_increment_reference(ex);
			}

			return cpy;
		}
		else if (type_id_throwable(id) == 0)
		{
			/* Just create a new throwable from the previous one, it will get flattened after creation */
			return value_create_throwable(v);
		}

		if (type_id_invalid(id) != 0)
		{
			return value_copy(v);
		}
	}

	return NULL;
}